

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O2

fdb_status
fdb_get_nearest(fdb_kvs_handle *handle,void *key,size_t keylen,fdb_doc *doc,
               fdb_get_nearest_opt_t opt)

{
  ushort uVar1;
  fdb_kvs_id_t id;
  kvs_ops_stat *pkVar2;
  hbtrie *trie;
  btreeblk_handle *pbVar3;
  fdb_custom_cmp_variable p_Var4;
  void *pvVar5;
  long lVar6;
  undefined8 uVar7;
  int64_t iVar8;
  uint8_t uVar9;
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [12];
  undefined1 auVar13 [14];
  size_t sVar14;
  hbtrie_result hVar15;
  int iVar16;
  int64_t iVar17;
  ulong uVar18;
  undefined1 *buf;
  undefined8 *puVar19;
  docio_handle *pdVar20;
  void *pvVar21;
  long *in_FS_OFFSET;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined8 uStack_140;
  undefined1 local_138 [8];
  hbtrie_iterator hit;
  fdb_kvs_id_t kv_id;
  undefined1 auStack_88 [8];
  docio_object _doc;
  size_t local_48;
  size_t ret_keylen;
  ulong local_38;
  uint64_t offset;
  
  buf = local_138;
  _doc.length.bodylen_ondisk = 0;
  auStack_88._0_2_ = 0;
  auStack_88._2_2_ = 0;
  auStack_88._4_4_ = 0;
  _doc.length.keylen = 0;
  _doc.length.metalen = 0;
  _doc.length.bodylen = 0;
  _doc.timestamp = 0;
  _doc._20_4_ = 0;
  _doc.key = (void *)0x0;
  _doc.field_3.seqnum = 0;
  _doc.meta = (void *)0x0;
  if (handle == (fdb_kvs_handle *)0x0) {
    puVar19 = &uStack_140;
    uStack_140 = 0xffffffffffffffe2;
    goto LAB_0011bf60;
  }
  if ((handle->config).do_not_search_wal != true) {
    puVar19 = &uStack_140;
    uStack_140 = 0xffffffffffffffec;
    goto LAB_0011bf60;
  }
  uStack_140 = 0xffffffffffffffff;
  if (keylen - 0xff81 < 0xffffffffffff0080) {
    return FDB_RESULT_INVALID_ARGS;
  }
  if (key == (void *)0x0) {
    return FDB_RESULT_INVALID_ARGS;
  }
  if (doc == (fdb_doc *)0x0) {
    return FDB_RESULT_INVALID_ARGS;
  }
  if (((handle->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x0) &&
     ((handle->config).blocksize - 0x100 < keylen)) {
    return FDB_RESULT_INVALID_ARGS;
  }
  LOCK();
  bVar22 = (handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\0';
  if (bVar22) {
    (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\x01';
  }
  UNLOCK();
  if (!bVar22) {
    puVar19 = &uStack_140;
    uStack_140 = 0xffffffffffffffd9;
    goto LAB_0011bf60;
  }
  if (handle->kvs != (kvs_info *)0x0) {
    uVar18 = (ulong)(handle->config).chunksize;
    ret_keylen = uVar18 + keylen;
    lVar6 = -(uVar18 + keylen + 0xf & 0xfffffffffffffff0);
    buf = local_138 + lVar6;
    id = handle->kvs->id;
    *(undefined8 *)(local_138 + lVar6 + -8) = 0x11bf2e;
    kvid2buf(uVar18,id,buf);
    *(undefined8 *)(local_138 + lVar6 + -8) = 0x11bf43;
    memcpy(buf + uVar18,key,keylen);
    keylen = ret_keylen;
    key = buf;
  }
  if (handle->shandle == (snap_handle *)0x0) {
    *(undefined8 *)(buf + -8) = 0x11bf80;
    fdb_check_file_reopen(handle,(file_status_t *)0x0);
    pdVar20 = handle->dhandle;
    if (handle->shandle == (snap_handle *)0x0) {
      *(undefined8 *)(buf + -8) = 0x11bf96;
      fdb_sync_db_header(handle);
    }
  }
  else {
    pdVar20 = handle->dhandle;
  }
  pkVar2 = handle->op_stats;
  *(undefined8 *)(buf + -8) = 0x11bfa5;
  atomic_incr_uint64_t(&pkVar2->num_gets,memory_order_relaxed);
  *(undefined8 *)(buf + -8) = 0x11bfad;
  _fdb_sync_dirty_root(handle);
  if ((char)in_FS_OFFSET[-0xf] == '\0') {
    lVar6 = *in_FS_OFFSET;
    ret_keylen = (size_t)pdVar20;
    *(undefined8 *)(buf + -8) = 0x11c2a3;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(lVar6 + -0x90),0xfff0,
               (allocator_type *)local_138);
    pdVar20 = (docio_handle *)ret_keylen;
    *(undefined8 *)(buf + -8) = 0x11c2bd;
    __cxa_thread_atexit(std::vector<char,_std::allocator<char>_>::~vector,
                        (vector<char,_std::allocator<char>_> *)(lVar6 + -0x90),&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0xf) = 1;
  }
  local_48 = 0;
  trie = handle->trie;
  *(undefined8 *)(buf + -8) = 0x11bfd7;
  hVar15 = hbtrie_iterator_init(trie,(hbtrie_iterator *)local_138,key,keylen);
  if (hVar15 == HBTRIE_RESULT_SUCCESS) {
    ret_keylen = (size_t)pdVar20;
    if (opt < 2) {
      do {
        pvVar21 = (void *)in_FS_OFFSET[-0x12];
        *(undefined8 *)(buf + -8) = 0x11c023;
        hVar15 = hbtrie_next((hbtrie_iterator *)local_138,pvVar21,&local_48,&local_38);
        sVar14 = local_48;
        p_Var4 = (handle->kvs_config).custom_cmp;
        pvVar21 = (void *)in_FS_OFFSET[-0x12];
        if (p_Var4 == (fdb_custom_cmp_variable)0x0) {
          *(undefined8 *)(buf + -8) = 0x11c055;
          iVar16 = _lex_keycmp(key,keylen,pvVar21,sVar14);
        }
        else {
          pvVar5 = (handle->kvs_config).custom_cmp_param;
          *(undefined8 *)(buf + -8) = 0x11c048;
          iVar16 = (*p_Var4)(key,keylen,pvVar21,sVar14,pvVar5);
        }
      } while (((0 < iVar16 || opt != '\0') && (opt != '\x01' || -1 < iVar16)) &&
              (hVar15 == HBTRIE_RESULT_SUCCESS));
    }
    else {
      do {
        pvVar21 = (void *)in_FS_OFFSET[-0x12];
        *(undefined8 *)(buf + -8) = 0x11c0a0;
        hVar15 = hbtrie_prev((hbtrie_iterator *)local_138,pvVar21,&local_48,&local_38);
        sVar14 = local_48;
        p_Var4 = (handle->kvs_config).custom_cmp;
        pvVar21 = (void *)in_FS_OFFSET[-0x12];
        if (p_Var4 == (fdb_custom_cmp_variable)0x0) {
          *(undefined8 *)(buf + -8) = 0x11c0d2;
          iVar16 = _lex_keycmp(key,keylen,pvVar21,sVar14);
        }
        else {
          pvVar5 = (handle->kvs_config).custom_cmp_param;
          *(undefined8 *)(buf + -8) = 0x11c0c5;
          iVar16 = (*p_Var4)(key,keylen,pvVar21,sVar14,pvVar5);
        }
      } while (((iVar16 < 0 || opt != '\x02') && (opt != '\x03' || iVar16 < 1)) &&
              (hVar15 == HBTRIE_RESULT_SUCCESS));
    }
    *(undefined8 *)(buf + -8) = 0x11c107;
    hbtrie_iterator_free((hbtrie_iterator *)local_138);
    pbVar3 = handle->bhandle;
    *(undefined8 *)(buf + -8) = 0x11c110;
    btreeblk_end(pbVar3);
    local_38 = local_38 >> 0x38 | (local_38 & 0xff000000000000) >> 0x28 |
               (local_38 & 0xff0000000000) >> 0x18 | (local_38 & 0xff00000000) >> 8 |
               (local_38 & 0xff000000) << 8 | (local_38 & 0xff0000) << 0x18 |
               (local_38 & 0xff00) << 0x28 | local_38 << 0x38;
    *(undefined8 *)(buf + -8) = 0x11c123;
    _fdb_release_dirty_root(handle);
    uVar18 = local_38;
    if (hVar15 != HBTRIE_RESULT_SUCCESS) goto LAB_0011c128;
    *(undefined8 *)(buf + -8) = 1;
    sVar14 = ret_keylen;
    uVar7 = *(undefined8 *)(buf + -8);
    *(undefined8 *)(buf + -8) = 0x11c14f;
    iVar17 = docio_read_doc((docio_handle *)sVar14,uVar18,(docio_object *)auStack_88,SUB81(uVar7,0))
    ;
    uVar7 = _doc._16_8_;
    if (iVar17 < 1) {
      LOCK();
      if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
        (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
      }
      UNLOCK();
      *(undefined8 *)(buf + -8) = 0xfffffffffffffff7;
      iVar8 = *(int64_t *)(buf + -8);
      if (iVar17 != 0) {
        iVar8 = iVar17;
      }
      return (fdb_status)iVar8;
    }
    if ((_doc.length.bodylen & 4) != 0) {
      *(undefined8 *)(buf + -8) = 1;
      uVar9 = (uint8_t)*(undefined8 *)(buf + -8);
      *(undefined8 *)(buf + -8) = 0x11c255;
      free_docio_object((docio_object *)auStack_88,uVar9,uVar9,uVar9);
      goto LAB_0011c128;
    }
    if (handle->kvs == (kvs_info *)0x0) {
LAB_0011c1b5:
      doc->key = (void *)_doc._16_8_;
      doc->seqnum = (fdb_seqnum_t)_doc.key;
      uVar7 = CONCAT44(auStack_88._4_4_,CONCAT22(auStack_88._2_2_,auStack_88._0_2_));
      auVar12._8_2_ = _doc.length.keylen;
      auVar12._10_2_ = _doc.length.metalen;
      auVar12._0_8_ = uVar7;
      auVar10._10_2_ = 0;
      auVar10._0_10_ = auVar12._0_10_;
      auVar10._12_2_ = SUB42(auStack_88._4_4_,2);
      auVar11._8_2_ = (short)auStack_88._4_4_;
      auVar11._0_8_ = uVar7;
      auVar11._10_4_ = auVar10._10_4_;
      auVar13._6_8_ = 0;
      auVar13._0_6_ = auVar11._8_6_;
      auVar23._0_8_ = (ulong)CONCAT22(auStack_88._2_2_,auStack_88._0_2_) & 0xffff;
      auVar23._8_4_ = (int)CONCAT82(SUB148(auVar13 << 0x40,6),auStack_88._2_2_);
      auVar23._12_4_ = 0;
      doc->keylen = auVar23._0_8_;
      doc->metalen = auVar23._8_8_;
      doc->bodylen = (ulong)(uint)auStack_88._4_4_;
      doc->meta = (void *)_doc.field_3;
      doc->body = _doc.meta;
      doc->deleted = (bool)((byte)_doc.length.bodylen >> 2 & 1);
      doc->size_ondisk =
           (ulong)((uint)(ushort)auStack_88._0_2_ + (uint)(ushort)auStack_88._2_2_ +
                  _doc.length._0_4_) + 0x20;
      doc->offset = local_38;
      LOCK();
      if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
        (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
      }
      UNLOCK();
      return FDB_RESULT_SUCCESS;
    }
    uVar1 = (handle->config).chunksize;
    *(undefined8 *)(buf + -8) = 0x11c185;
    buf2kvid((ulong)uVar1,(void *)uVar7,(fdb_kvs_id_t *)&hit.flags);
    uVar7 = _doc._16_8_;
    if (hit._144_8_ == handle->kvs->id) {
      auStack_88._0_2_ = auStack_88._0_2_ - uVar1;
      pvVar21 = (void *)((ulong)uVar1 + _doc._16_8_);
      uVar18 = (ulong)(ushort)auStack_88._0_2_;
      *(undefined8 *)(buf + -8) = 0x11c1b2;
      memmove((void *)uVar7,pvVar21,uVar18);
      goto LAB_0011c1b5;
    }
    LOCK();
    if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
    }
    UNLOCK();
    *(undefined8 *)(buf + -8) = 1;
    uVar9 = (uint8_t)*(undefined8 *)(buf + -8);
    *(undefined8 *)(buf + -8) = 0x11c276;
    free_docio_object((docio_object *)auStack_88,uVar9,uVar9,uVar9);
  }
  else {
    pbVar3 = handle->bhandle;
    *(undefined8 *)(buf + -8) = 0x11bfe4;
    btreeblk_end(pbVar3);
    local_38 = local_38 >> 0x38 | (local_38 & 0xff000000000000) >> 0x28 |
               (local_38 & 0xff0000000000) >> 0x18 | (local_38 & 0xff00000000) >> 8 |
               (local_38 & 0xff000000) << 8 | (local_38 & 0xff0000) << 0x18 |
               (local_38 & 0xff00) << 0x28 | local_38 << 0x38;
    *(undefined8 *)(buf + -8) = 0x11bff7;
    _fdb_release_dirty_root(handle);
LAB_0011c128:
    LOCK();
    if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
    }
    UNLOCK();
  }
  puVar19 = (undefined8 *)(buf + -8);
  *(undefined8 *)(buf + -8) = 0xfffffffffffffff7;
LAB_0011bf60:
  return (fdb_status)*puVar19;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_nearest(fdb_kvs_handle *handle,
                           const void *key,
                           size_t keylen,
                           fdb_doc *doc,
                           fdb_get_nearest_opt_t opt)
{
    uint64_t offset;
    int64_t _offset;
    struct docio_object _doc;
    struct docio_handle *dhandle;
    hbtrie_result hr = HBTRIE_RESULT_FAIL;
    fdb_txn *txn;
    //fdb_doc doc_kv;
    LATENCY_STAT_START();

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!handle->config.do_not_search_wal) {
        return FDB_RESULT_INVALID_CONFIG;
    }

    if (!doc || !key || keylen == 0 ||
        keylen > FDB_MAX_KEYLEN ||
        (handle->kvs_config.custom_cmp &&
            keylen > handle->config.blocksize - HBTRIE_HEADROOM)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    // Need to prepend 8-byte ID in multi-KVS mode.
    void* doc_key = (void*)key;
    size_t doc_keylen = keylen;

    if (handle->kvs) {
        // multi KV instance mode
        int size_chunk = handle->config.chunksize;
        doc_keylen = keylen + size_chunk;
        doc_key = alca(uint8_t, doc_keylen);
        kvid2buf(size_chunk, handle->kvs->id, doc_key);
        memcpy((uint8_t*)doc_key + size_chunk, key, keylen);
    }

    if (!handle->shandle) {
        fdb_check_file_reopen(handle, NULL);
        txn = handle->fhandle->root->txn;
        if (!txn) {
            txn = &handle->file->global_txn;
        }
    } else {
        txn = handle->shandle->snap_txn;
    }

    dhandle = handle->dhandle;

    if (!handle->shandle) {
        fdb_sync_db_header(handle);
    }

    atomic_incr_uint64_t(&handle->op_stats->num_gets, std::memory_order_relaxed);

    _fdb_sync_dirty_root(handle);

    struct hbtrie_iterator hit;

    thread_local std::vector<char> ret_key_buf(FDB_MAX_KEYLEN_INTERNAL);
    size_t ret_keylen = 0;

    hr = hbtrie_iterator_init(handle->trie, &hit, doc_key, doc_keylen);
    if (hr == HBTRIE_RESULT_SUCCESS) {
        // NOTE: Due to HB-trie's suffix skip, may need to call prev/next
        //       multiple times.
        if (opt == FDB_GET_GREATER_OR_EQUAL || opt == FDB_GET_GREATER) {
            do {
                hr = hbtrie_next(&hit, &ret_key_buf[0], &ret_keylen, (void *)&offset);
                int cmp = 0;
                if (handle->kvs_config.custom_cmp) {
                    cmp = handle->kvs_config.custom_cmp(
                              doc_key, doc_keylen,
                              &ret_key_buf[0], ret_keylen,
                              handle->kvs_config.custom_cmp_param );
                } else {
                    cmp = _lex_keycmp( doc_key, doc_keylen,
                                       &ret_key_buf[0], ret_keylen );
                }
                if (opt == FDB_GET_GREATER_OR_EQUAL && cmp <= 0) break;
                if (opt == FDB_GET_GREATER && cmp < 0) break;
            } while (hr == HBTRIE_RESULT_SUCCESS);

        } else {
            do {
                hr = hbtrie_prev(&hit, &ret_key_buf[0], &ret_keylen, (void *)&offset);
                int cmp = 0;
                if (handle->kvs_config.custom_cmp) {
                    cmp = handle->kvs_config.custom_cmp(
                              doc_key, doc_keylen,
                              &ret_key_buf[0], ret_keylen,
                              handle->kvs_config.custom_cmp_param );
                } else {
                    cmp = _lex_keycmp( doc_key, doc_keylen,
                                       &ret_key_buf[0], ret_keylen );
                }
                if (opt == FDB_GET_SMALLER_OR_EQUAL && cmp >= 0) break;
                if (opt == FDB_GET_SMALLER && cmp > 0) break;
            } while (hr == HBTRIE_RESULT_SUCCESS);
        }
        hbtrie_iterator_free(&hit);
    }
    btreeblk_end(handle->bhandle);
    offset = _endian_decode(offset);

    _fdb_release_dirty_root(handle);

    if (hr == HBTRIE_RESULT_SUCCESS) {
        _offset = docio_read_doc(dhandle, offset, &_doc, true);
        if (_offset <= 0) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return _offset < 0 ? (fdb_status)_offset : FDB_RESULT_KEY_NOT_FOUND;
        }

        if (_doc.length.flag & DOCIO_DELETED) {
            free_docio_object(&_doc, 1, 1, 1);
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return FDB_RESULT_KEY_NOT_FOUND;
        }

        if (handle->kvs) {
            fdb_kvs_id_t kv_id;
            size_t size_chunk = handle->config.chunksize;
            buf2kvid(size_chunk, _doc.key, &kv_id);
            if (kv_id != handle->kvs->id) {
                atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
                free_docio_object(&_doc, 1, 1, 1);
                return FDB_RESULT_KEY_NOT_FOUND;
            }
            _doc.length.keylen -= size_chunk;
            memmove(_doc.key, (uint8_t*)_doc.key + size_chunk, _doc.length.keylen);
        }
        doc->key = _doc.key;
        doc->keylen = _doc.length.keylen;

        doc->seqnum = _doc.seqnum;
        doc->metalen = _doc.length.metalen;
        doc->bodylen = _doc.length.bodylen;
        doc->meta = _doc.meta;
        doc->body = _doc.body;
        doc->deleted = _doc.length.flag & DOCIO_DELETED;
        doc->size_ondisk = _fdb_get_docsize(_doc.length);
        doc->offset = offset;

        LATENCY_STAT_END(handle->file, FDB_LATENCY_GETS);
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_SUCCESS;
    }

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_KEY_NOT_FOUND;
}